

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

sunindextype SUNDlsMat_densePOTRF(sunrealtype **a,sunindextype m)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sunrealtype sVar5;
  double dVar6;
  
  if (0 < m) {
    lVar4 = 0;
    do {
      psVar1 = a[lVar4];
      lVar2 = lVar4;
      if (lVar4 != 0) {
        do {
          sVar5 = psVar1[lVar2];
          lVar3 = 0;
          do {
            sVar5 = sVar5 - a[lVar3][lVar2] * a[lVar3][lVar4];
            psVar1[lVar2] = sVar5;
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
          lVar2 = lVar2 + 1;
        } while (lVar2 < m);
      }
      dVar6 = psVar1[lVar4];
      if (dVar6 <= 0.0) {
        return lVar4 + 1;
      }
      lVar2 = lVar4;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      do {
        psVar1[lVar2] = psVar1[lVar2] / dVar6;
        lVar2 = lVar2 + 1;
      } while (lVar2 < m);
      lVar4 = lVar4 + 1;
    } while (lVar4 != m);
  }
  return 0;
}

Assistant:

sunindextype SUNDlsMat_densePOTRF(sunrealtype** a, sunindextype m)
{
  sunrealtype *a_col_j, *a_col_k;
  sunrealtype a_diag;
  sunindextype i, j, k;

  for (j = 0; j < m; j++)
  {
    a_col_j = a[j];

    if (j > 0)
    {
      for (i = j; i < m; i++)
      {
        for (k = 0; k < j; k++)
        {
          a_col_k = a[k];
          a_col_j[i] -= a_col_k[i] * a_col_k[j];
        }
      }
    }

    a_diag = a_col_j[j];
    if (a_diag <= ZERO) { return (j + 1); }
    a_diag = SUNRsqrt(a_diag);

    for (i = j; i < m; i++) { a_col_j[i] /= a_diag; }
  }

  return (0);
}